

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::UnlockResources(cmCTestMultiProcessHandler *this,int index)

{
  mapped_type pcVar1;
  bool bVar2;
  mapped_type *ppcVar3;
  reference puVar4;
  reference __x;
  size_t sVar5;
  string *i;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  unsigned_long local_40;
  unsigned_long p;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  cmCTestTestProperties *properties;
  cmCTestMultiProcessHandler *pcStack_10;
  int index_local;
  cmCTestMultiProcessHandler *this_local;
  
  properties._4_4_ = index;
  pcStack_10 = this;
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)((long)&properties + 4));
  pcVar1 = *ppcVar3;
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&pcVar1->Affinity);
  p = (unsigned_long)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&pcVar1->Affinity);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&p);
    if (!bVar2) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    local_40 = *puVar4;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              (&this->ProcessorsAvailable,&local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&pcVar1->Affinity);
  __end1_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pcVar1->ProjectResources);
  i = (string *)
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&pcVar1->ProjectResources);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&i);
    if (!bVar2) break;
    __x = std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1_1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&this->ProjectResourcesLocked,__x);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  if ((pcVar1->RunSerial & 1U) != 0) {
    this->SerialTestRunning = false;
  }
  sVar5 = GetProcessorsUsed(this,properties._4_4_);
  this->RunningCount = this->RunningCount - sVar5;
  return;
}

Assistant:

void cmCTestMultiProcessHandler::UnlockResources(int index)
{
  auto* properties = this->Properties[index];

  for (auto p : properties->Affinity) {
    this->ProcessorsAvailable.insert(p);
  }
  properties->Affinity.clear();

  for (std::string const& i : properties->ProjectResources) {
    this->ProjectResourcesLocked.erase(i);
  }

  if (properties->RunSerial) {
    this->SerialTestRunning = false;
  }

  this->RunningCount -= this->GetProcessorsUsed(index);
}